

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O2

void gimage::paste<float>
               (Image<float,_gimage::PixelTraits<float>_> *image,
               Image<float,_gimage::PixelTraits<float>_> *image2,long i0,long k0,int d0,
               float opacity)

{
  float ***pppfVar1;
  float ***pppfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (1.0 <= opacity) {
    uVar4 = image2->height;
    if (image2->height < 1) {
      uVar4 = 0;
    }
    uVar3 = (ulong)(uint)image2->depth;
    if (image2->depth < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      lVar9 = uVar5 + (long)d0;
      if ((-1 < lVar9) && (lVar9 < image->depth)) {
        lVar10 = image2->width;
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
          lVar8 = uVar7 + k0;
          if ((-1 < lVar8) && (lVar8 < image->height)) {
            pppfVar1 = image2->img;
            pppfVar2 = image->img;
            for (lVar6 = 0; lVar10 != lVar6; lVar6 = lVar6 + 1) {
              if ((-1 < i0 + lVar6) && (i0 + lVar6 < image->width)) {
                pppfVar2[lVar9][lVar8][i0 + lVar6] = pppfVar1[uVar5][uVar7][lVar6];
              }
            }
          }
        }
      }
    }
  }
  else {
    if (opacity <= 0.0) {
      opacity = 0.0;
    }
    uVar4 = image2->height;
    if (image2->height < 1) {
      uVar4 = 0;
    }
    uVar3 = (ulong)(uint)image2->depth;
    if (image2->depth < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      lVar9 = uVar5 + (long)d0;
      if ((-1 < lVar9) && (lVar9 < image->depth)) {
        lVar10 = image2->width;
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
          lVar8 = uVar7 + k0;
          if ((-1 < lVar8) && (lVar8 < image->height)) {
            pppfVar1 = image->img;
            pppfVar2 = image2->img;
            for (lVar6 = 0; lVar10 != lVar6; lVar6 = lVar6 + 1) {
              if ((-1 < i0 + lVar6) && (i0 + lVar6 < image->width)) {
                pppfVar1[lVar9][lVar8][i0 + lVar6] =
                     pppfVar2[uVar5][uVar7][lVar6] * opacity +
                     pppfVar1[lVar9][lVar8][i0 + lVar6] * (1.0 - opacity);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void paste(Image<T> &image, const Image<T> &image2, long i0=0, long k0=0,
                             int d0=0, float opacity=1.0f)
{
  if (opacity < 1)
  {
    opacity=std::max(0.0f, opacity);

    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                float v=(1-opacity)*image.get(i0+i, k0+k, d0+d);
                v+=opacity*image2.get(i, k, d);
                image.set(i0+i, k0+k, d0+d, static_cast<typename Image<T>::store_t>(v));
              }
  }
  else
  {
    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                image.set(i0+i, k0+k, d0+d, image2.get(i, k, d));
              }
  }
}